

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::AND_ID_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  CPU *this_local;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  uVar2 = ReadWord(this,(ushort)bVar1);
  bVar1 = ReadByte(this,uVar2 + this->Y);
  this->A = this->A & bVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::AND_ID_Y()
{
    cycles = 5;
    A &= ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}